

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  ulong *in_RSI;
  Slice *in_RDI;
  size_t digits_consumed;
  uint8_t ch;
  uint8_t *current;
  uint8_t *end;
  uint8_t *start;
  uint64_t value;
  char kLastDigitOfMaxUint64;
  uint64_t kMaxUint64;
  byte *local_48;
  ulong local_30;
  
  local_30 = 0;
  pbVar2 = (byte *)Slice::data(in_RDI);
  sVar3 = Slice::size(in_RDI);
  local_48 = pbVar2;
  while( true ) {
    if (((local_48 == pbVar2 + sVar3) || (bVar1 = *local_48, bVar1 < 0x30)) || (0x39 < bVar1)) {
      *in_RSI = local_30;
      Slice::remove_prefix(in_RDI,(long)local_48 - (long)pbVar2);
      return (long)local_48 - (long)pbVar2 != 0;
    }
    if ((0x1999999999999999 < local_30) || ((local_30 == 0x1999999999999999 && (0x35 < bVar1))))
    break;
    local_30 = local_30 * 10 + (long)(int)(bVar1 - 0x30);
    local_48 = local_48 + 1;
  }
  return false;
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}